

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  byte bVar1;
  lua_State *L1;
  ulong uVar2;
  StkId pTVar3;
  lu_mem *osize;
  int i;
  ulong uVar4;
  bool bVar5;
  
  bVar1 = L->l_G->currentwhite;
switchD_0010d32a_caseD_a:
  while( true ) {
    L1 = (lua_State *)((lua_State *)p)->next;
    if (L1 == (lua_State *)0x0) {
      return (GCObject **)0x0;
    }
    bVar5 = count == 0;
    count = count - 1;
    if (bVar5) {
      return &((lua_State *)p)->next;
    }
    if ((byte)((L1->marked ^ 3) & (bVar1 ^ 3)) == 0) break;
    L1->marked = L1->marked & 0xf8 | bVar1 & 3;
    p = (GCObject **)L1;
  }
  ((lua_State *)p)->next = L1->next;
  switch(L1->tt) {
  case '\x04':
    luaS_remove(L,(TString *)L1);
    pTVar3 = (StkId)(ulong)*(byte *)((long)&L1->nci + 1);
    goto LAB_0010d3e1;
  case '\x05':
    luaH_free(L,(Table *)L1);
    goto switchD_0010d32a_caseD_a;
  case '\x06':
    for (uVar4 = 0; uVar2 = (ulong)(byte)L1->nci, uVar4 < uVar2; uVar4 = uVar4 + 1) {
      if ((&L1->ci)[uVar4] != (CallInfo *)0x0) {
        luaC_upvdeccount(L,(UpVal *)(&L1->ci)[uVar4]);
      }
    }
    luaM_realloc_(L,L1,uVar2 * 8 + 0x20,0);
    goto switchD_0010d32a_caseD_a;
  case '\a':
    osize = &L1->l_G->GCestimate;
    break;
  case '\b':
    luaE_freethread(L,L1);
    goto switchD_0010d32a_caseD_a;
  case '\t':
    luaF_freeproto(L,(Proto *)L1);
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    goto switchD_0010d32a_caseD_a;
  case '\x14':
    pTVar3 = L1->top;
LAB_0010d3e1:
    osize = (lu_mem *)((long)&pTVar3[1].tt_ + 1);
    break;
  default:
    if (L1->tt != '&') goto switchD_0010d32a_caseD_a;
    osize = (lu_mem *)((ulong)(byte)L1->nci * 0x10 + 0x20);
  }
  luaM_realloc_(L,L1,(size_t)osize,0);
  goto switchD_0010d32a_caseD_a;
}

Assistant:

static GCObject **sweeplist(lua_State *L, GCObject **p, lu_mem count) {
    global_State *g = G(L);
    int ow = otherwhite(g);
    int white = luaC_white(g);  /* current white */
    while (*p != NULL && count-- > 0) {
        GCObject *curr = *p;
        int marked = curr->marked;
        if (isdeadm(ow, marked)) {  /* is 'curr' dead? */
            *p = curr->next;  /* remove 'curr' from list */
            freeobj(L, curr);  /* erase 'curr' */
        } else {  /* change mark to 'white' */
            curr->marked = cast_byte((marked & maskcolors) | white);
            p = &curr->next;  /* go to next element */
        }
    }
    return (*p == NULL) ? NULL : p;
}